

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O1

bool __thiscall jpge::jpeg_encoder::second_pass_init(jpeg_encoder *this)

{
  jpeg_encoder *this_00;
  
  this_00 = this;
  compute_huffman_table
            (this,this->m_huff_codes[0],this->m_huff_code_sizes[0],this->m_huff_bits[0],
             this->m_huff_val[0]);
  compute_huffman_table
            (this_00,this->m_huff_codes[2],this->m_huff_code_sizes[2],this->m_huff_bits[2],
             this->m_huff_val[2]);
  if (1 < this->m_num_components) {
    compute_huffman_table
              (this_00,this->m_huff_codes[1],this->m_huff_code_sizes[1],this->m_huff_bits[1],
               this->m_huff_val[1]);
    compute_huffman_table
              (this_00,this->m_huff_codes[3],this->m_huff_code_sizes[3],this->m_huff_bits[3],
               this->m_huff_val[3]);
  }
  this->m_bit_buffer = 0;
  this->m_bits_in = 0;
  this->m_last_dc_val[0] = 0;
  this->m_last_dc_val[1] = 0;
  this->m_last_dc_val[2] = 0;
  this->m_mcu_y_ofs = '\0';
  this->m_pass_num = '\x01';
  emit_markers(this);
  this->m_pass_num = '\x02';
  return true;
}

Assistant:

bool jpeg_encoder::second_pass_init()
{
  compute_huffman_table(&m_huff_codes[0+0][0], &m_huff_code_sizes[0+0][0], m_huff_bits[0+0], m_huff_val[0+0]);
  compute_huffman_table(&m_huff_codes[2+0][0], &m_huff_code_sizes[2+0][0], m_huff_bits[2+0], m_huff_val[2+0]);
  if (m_num_components > 1)
  {
    compute_huffman_table(&m_huff_codes[0+1][0], &m_huff_code_sizes[0+1][0], m_huff_bits[0+1], m_huff_val[0+1]);
    compute_huffman_table(&m_huff_codes[2+1][0], &m_huff_code_sizes[2+1][0], m_huff_bits[2+1], m_huff_val[2+1]);
  }
  first_pass_init();
  emit_markers();
  m_pass_num = 2;
  return true;
}